

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

bool clip_image_load_from_bytes(uchar *bytes,size_t bytes_length,clip_image_u8 *img)

{
  stbi_uc *rgb_pixels;
  int ny;
  int nx;
  int nc;
  
  rgb_pixels = stbi_load_from_memory(bytes,(int)bytes_length,&nx,&ny,&nc,3);
  if (rgb_pixels == (stbi_uc *)0x0) {
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to decode image bytes\n",
                        "clip_image_load_from_bytes");
    }
  }
  else {
    clip_build_img_from_pixels(rgb_pixels,nx,ny,img);
    free(rgb_pixels);
  }
  return rgb_pixels != (stbi_uc *)0x0;
}

Assistant:

bool clip_image_load_from_bytes(const unsigned char * bytes, size_t bytes_length, struct clip_image_u8 * img) {
    int nx, ny, nc;
    auto * data = stbi_load_from_memory(bytes, bytes_length, &nx, &ny, &nc, 3);
    if (!data) {
        LOG_ERR("%s: failed to decode image bytes\n", __func__);
        return false;
    }
    clip_build_img_from_pixels(data, nx, ny, img);
    stbi_image_free(data);
    return true;
}